

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api_header_generator.cpp
# Opt level: O2

void __thiscall APIHeader_generator_Test::TestBody(APIHeader_generator_Test *this)

{
  AssertionResult gtest_ar_;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_8;
  
  local_8.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&local_8);
  return;
}

Assistant:

TEST(APIHeader, generator)
{
    EXPECT_TRUE(size_t(4) == size_t(4));
}